

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O2

void canvas_setgraph(_glist *x,int flag,int nogoprect)

{
  int iVar1;
  bool bVar2;
  
  if ((x->gl_owner == (_glist *)0x0) || ((*(ushort *)&x->field_0xe8 & 0x808) != 0)) {
    bVar2 = false;
  }
  else {
    iVar1 = glist_isvisible(x->gl_owner);
    bVar2 = iVar1 != 0;
  }
  if (flag == 0) {
    iVar1 = glist_isgraph(x);
    if (iVar1 != 0) {
      if (bVar2) {
        gobj_vis((t_gobj *)x,x->gl_owner,0);
        x->field_0xe9 = x->field_0xe9 & 0xfc;
        goto LAB_0013ab35;
      }
      x->field_0xe9 = x->field_0xe9 & 0xfc;
    }
  }
  else {
    if (x->gl_pixwidth < 1) {
      x->gl_pixwidth = 200;
    }
    if (x->gl_pixheight < 1) {
      x->gl_pixheight = 0x8c;
    }
    if (bVar2) {
      gobj_vis((t_gobj *)x,x->gl_owner,0);
    }
    *(ushort *)&x->field_0xe8 =
         ((ushort)*(undefined4 *)&x->field_0xe8 & 0xfc7f) +
         ((ushort)(nogoprect == 0) << 7 | (ushort)((flag & 2U) << 8)) + 0x100;
    iVar1 = glist_isvisible(x);
    if ((iVar1 != 0) && ((x->field_0xe8 & 0x80) != 0)) {
      glist_redraw(x);
    }
    if (bVar2) {
LAB_0013ab35:
      gobj_vis((t_gobj *)x,x->gl_owner,1);
      canvas_fixlinesfor(x->gl_owner,&x->gl_obj);
      return;
    }
  }
  return;
}

Assistant:

void canvas_setgraph(t_glist *x, int flag, int nogoprect)
{
    int can_graph_on_parent = x->gl_owner && !x->gl_isclone && !x->gl_loading
        && glist_isvisible(x->gl_owner);
    if (!flag && glist_isgraph(x))
    {
        if (can_graph_on_parent)
            gobj_vis(&x->gl_gobj, x->gl_owner, 0);
        x->gl_isgraph = x->gl_hidetext = 0;
        if (can_graph_on_parent)
        {
            gobj_vis(&x->gl_gobj, x->gl_owner, 1);
            canvas_fixlinesfor(x->gl_owner, &x->gl_obj);
        }
    }
    else if (flag)
    {
        if (x->gl_pixwidth <= 0)
            x->gl_pixwidth = GLIST_DEFGRAPHWIDTH;

        if (x->gl_pixheight <= 0)
            x->gl_pixheight = GLIST_DEFGRAPHHEIGHT;

        if (can_graph_on_parent)
            gobj_vis(&x->gl_gobj, x->gl_owner, 0);
        x->gl_isgraph = 1;
        x->gl_hidetext = !(!(flag&2));
        x->gl_goprect = !nogoprect;
        if (glist_isvisible(x) && x->gl_goprect)
            glist_redraw(x);
        if (can_graph_on_parent)
        {
            gobj_vis(&x->gl_gobj, x->gl_owner, 1);
            canvas_fixlinesfor(x->gl_owner, &x->gl_obj);
        }
    }
}